

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

stb_vorbis *
stb_vorbis_open_file_section
          (FILE *file,int close_on_free,int *error,stb_vorbis_alloc *alloc,uint length)

{
  int iVar1;
  undefined4 *in_RDX;
  FILE *in_RDI;
  stb_vorbis p;
  stb_vorbis *f;
  stb_vorbis_alloc *in_stack_fffffffffffff858;
  stb_vorbis *in_stack_fffffffffffff860;
  stb_vorbis *in_stack_fffffffffffff880;
  undefined4 local_70c;
  vorb *in_stack_fffffffffffffdd8;
  stb_vorbis *local_8;
  
  vorbis_init(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  ftell(in_RDI);
  iVar1 = start_decoder(in_stack_fffffffffffffdd8);
  if ((iVar1 == 0) ||
     (local_8 = vorbis_alloc(in_stack_fffffffffffff860), local_8 == (stb_vorbis *)0x0)) {
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = local_70c;
    }
    vorbis_deinit(in_stack_fffffffffffff880);
    local_8 = (stb_vorbis *)0x0;
  }
  else {
    memcpy(local_8,&stack0xfffffffffffff858,0x770);
    vorbis_pump_first_frame(in_stack_fffffffffffff860);
  }
  return local_8;
}

Assistant:

stb_vorbis * stb_vorbis_open_file_section(FILE *file, int close_on_free, int *error, const stb_vorbis_alloc *alloc, unsigned int length)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.f = file;
   p.f_start = (uint32) ftell(file);
   p.stream_len   = length;
   p.close_on_free = close_on_free;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}